

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables_map.cpp
# Opt level: O0

variable_value * __thiscall
program_options::abstract_variables_map::operator[](abstract_variables_map *this,string *name)

{
  bool bVar1;
  variable_value *this_00;
  abstract_variables_map *in_RSI;
  long *in_RDI;
  variable_value *v2;
  variable_value *v;
  variable_value *local_8;
  
  this_00 = (variable_value *)(**(code **)(*in_RDI + 0x10))(in_RDI,in_RSI);
  bVar1 = variable_value::empty((variable_value *)0x208492);
  if ((bVar1) && (in_RDI[1] != 0)) {
    local_8 = operator[](in_RSI,(string *)this_00);
  }
  else {
    bVar1 = variable_value::defaulted(this_00);
    local_8 = this_00;
    if ((bVar1) && (in_RDI[1] != 0)) {
      local_8 = operator[](in_RSI,(string *)this_00);
      bVar1 = variable_value::empty((variable_value *)0x2084fc);
      if ((bVar1) || (bVar1 = variable_value::defaulted(local_8), bVar1)) {
        local_8 = this_00;
      }
    }
  }
  return local_8;
}

Assistant:

const variable_value&
abstract_variables_map::operator[](const std::string& name) const
{
    const variable_value& v = get(name);
    if (v.empty() && m_next)
        return (*m_next)[name];
    else if (v.defaulted() && m_next) {
        const variable_value& v2 = (*m_next)[name];
        if (!v2.empty() && !v2.defaulted())
            return v2;
        else return v;
    } else {
        return v;
    }
}